

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-pprint.hh
# Opt level: O0

ostream * std::operator<<(ostream *os,
                         vector<tinyusdz::value::matrix2d,_std::allocator<tinyusdz::value::matrix2d>_>
                         *v)

{
  size_type sVar1;
  const_reference m;
  ulong local_20;
  size_t i;
  vector<tinyusdz::value::matrix2d,_std::allocator<tinyusdz::value::matrix2d>_> *v_local;
  ostream *os_local;
  
  std::operator<<(os,"[");
  local_20 = 0;
  while( true ) {
    sVar1 = vector<tinyusdz::value::matrix2d,_std::allocator<tinyusdz::value::matrix2d>_>::size(v);
    if (sVar1 <= local_20) break;
    m = vector<tinyusdz::value::matrix2d,_std::allocator<tinyusdz::value::matrix2d>_>::operator[]
                  (v,local_20);
    operator<<(os,m);
    sVar1 = vector<tinyusdz::value::matrix2d,_std::allocator<tinyusdz::value::matrix2d>_>::size(v);
    if (local_20 != sVar1 - 1) {
      std::operator<<(os,", ");
    }
    local_20 = local_20 + 1;
  }
  std::operator<<(os,"]");
  return os;
}

Assistant:

std::ostream &operator<<(std::ostream &os, const std::vector<T> &v) {
  os << "[";
  for (size_t i = 0; i < v.size(); i++) {
    os << v[i];
    if (i != (v.size() - 1)) {
      os << ", ";
    }
  }
  os << "]";
  return os;
}